

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::ContentEncoding::ParseCompressionEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentCompression *compression)

{
  long lVar1;
  int iVar2;
  long lVar3;
  longlong lVar4;
  uchar *puVar5;
  int read_status;
  uchar *buf;
  size_t buflen;
  longlong algo;
  long status;
  longlong size_1;
  longlong id;
  long lStack_48;
  bool valid;
  longlong stop;
  longlong pos;
  ContentCompression *compression_local;
  IMkvReader *pReader_local;
  longlong size_local;
  longlong start_local;
  ContentEncoding *this_local;
  
  pos = (longlong)compression;
  compression_local = (ContentCompression *)pReader;
  pReader_local = (IMkvReader *)size;
  size_local = start;
  start_local = (longlong)this;
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x10d3,
                  "long mkvparser::ContentEncoding::ParseCompressionEntry(long long, long long, IMkvReader *, ContentCompression *)"
                 );
  }
  if (compression == (ContentCompression *)0x0) {
    __assert_fail("compression",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x10d4,
                  "long mkvparser::ContentEncoding::ParseCompressionEntry(long long, long long, IMkvReader *, ContentCompression *)"
                 );
  }
  lStack_48 = start + size;
  id._7_1_ = 0;
  stop = start;
  do {
    if (lStack_48 <= stop) {
      if ((id._7_1_ & 1) == 0) {
        return -2;
      }
      return 0;
    }
    lVar3 = ParseElementHeader((IMkvReader *)compression_local,&stop,lStack_48,&size_1,&status);
    lVar1 = status;
    if (lVar3 < 0) {
      return lVar3;
    }
    if (size_1 == 0x4254) {
      lVar4 = UnserializeUInt((IMkvReader *)compression_local,stop,status);
      if (lVar4 < 0) {
        return -2;
      }
      *(longlong *)pos = lVar4;
      id._7_1_ = 1;
    }
    else if (size_1 == 0x4255) {
      if (status < 1) {
        return -2;
      }
      puVar5 = SafeArrayAlloc<unsigned_char>(1,status);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      iVar2 = (**(code **)compression_local->algo)(compression_local,stop,lVar1,puVar5);
      if (iVar2 != 0) {
        if (puVar5 == (uchar *)0x0) {
          return lVar3;
        }
        operator_delete__(puVar5);
        return lVar3;
      }
      if (*(long *)(pos + 8) != 0) {
        if (puVar5 != (uchar *)0x0) {
          operator_delete__(puVar5);
        }
        return -2;
      }
      *(uchar **)(pos + 8) = puVar5;
      *(long *)(pos + 0x10) = lVar1;
    }
    stop = status + stop;
    if (lStack_48 < stop) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseCompressionEntry(long long start, long long size,
                                            IMkvReader* pReader,
                                            ContentCompression* compression) {
  assert(pReader);
  assert(compression);

  long long pos = start;
  const long long stop = start + size;

  bool valid = false;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompAlgo) {
      long long algo = UnserializeUInt(pReader, pos, size);
      if (algo < 0)
        return E_FILE_FORMAT_INVALID;
      compression->algo = algo;
      valid = true;
    } else if (id == libwebm::kMkvContentCompSettings) {
      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      // There should be only one settings element per content compression.
      if (compression->settings != NULL) {
        delete[] buf;
        return E_FILE_FORMAT_INVALID;
      }

      compression->settings = buf;
      compression->settings_len = buflen;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  // ContentCompAlgo is mandatory
  if (!valid)
    return E_FILE_FORMAT_INVALID;

  return 0;
}